

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

Var * __thiscall
Js::DiagNativeStackFrame::GetSlotOffsetLocation
          (DiagNativeStackFrame *this,RegSlot slotId,bool allowTemp)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  undefined4 *puVar4;
  int local_24;
  byte local_1d;
  int32 slotOffset;
  bool allowTemp_local;
  DiagNativeStackFrame *pDStack_18;
  RegSlot slotId_local;
  DiagNativeStackFrame *this_local;
  
  local_1d = allowTemp;
  slotOffset = slotId;
  pDStack_18 = this;
  pFVar3 = DiagStackFrame::GetFunction(&this->super_DiagStackFrame);
  if (pFVar3 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x21e,"(GetFunction() != __null)","GetFunction() != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = DiagStackFrame::GetFunction(&this->super_DiagStackFrame);
  bVar2 = FunctionBody::GetSlotOffset(pFVar3,slotOffset,&local_24,(bool)(local_1d & 1));
  if (bVar2) {
    if (this->m_localVarSlotsOffset == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                  ,0x223,"(m_localVarSlotsOffset != InvalidOffset)",
                                  "m_localVarSlotsOffset != InvalidOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = (DiagNativeStackFrame *)
                 ((long)this->m_stackAddr + (long)(this->m_localVarSlotsOffset + local_24));
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x22a,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local = (DiagNativeStackFrame *)0x0;
  }
  return (Var *)this_local;
}

Assistant:

Var * DiagNativeStackFrame::GetSlotOffsetLocation(RegSlot slotId, bool allowTemp)
    {
        Assert(GetFunction() != NULL);

        int32 slotOffset;
        if (GetFunction()->GetSlotOffset(slotId, &slotOffset, allowTemp))
        {
            Assert(m_localVarSlotsOffset != InvalidOffset);
            slotOffset = m_localVarSlotsOffset + slotOffset;

            // We will have the var offset only (which is always the Var size. With TypeSpecialization, below will change to accommodate double offset.
            return (Js::Var *)(((char *)m_stackAddr) + slotOffset);
        }

        Assert(false);
        return NULL;
    }